

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Shutdown(void)

{
  int *piVar1;
  ImFontAtlas *this;
  ImGuiWindow *pIVar2;
  ImGuiWindow **ppIVar3;
  void *pvVar4;
  ImGuiIniData *pIVar5;
  ImGuiColMod *pIVar6;
  ImGuiStyleMod *pIVar7;
  ImFont **ppIVar8;
  ImGuiPopupRef *pIVar9;
  char *pcVar10;
  unsigned_short *puVar11;
  FILE *__stream;
  ImGuiTextBuffer *pIVar12;
  ImGuiContext *pIVar13;
  ImGuiContext *pIVar14;
  long lVar15;
  long lVar16;
  
  pIVar13 = GImGui;
  this = (GImGui->IO).Fonts;
  if (this != (ImFontAtlas *)0x0) {
    ImFontAtlas::Clear(this);
  }
  if (pIVar13->Initialized == true) {
    SaveIniSettingsToDisk((pIVar13->IO).IniFilename);
    if (0 < (pIVar13->Windows).Size) {
      lVar15 = 0;
      do {
        ImGuiWindow::~ImGuiWindow((pIVar13->Windows).Data[lVar15]);
        if ((pIVar13->Windows).Size <= lVar15) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                        ,0x38b,
                        "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
        }
        pIVar2 = (pIVar13->Windows).Data[lVar15];
        if (pIVar2 != (ImGuiWindow *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar2);
        lVar15 = lVar15 + 1;
      } while (lVar15 < (pIVar13->Windows).Size);
    }
    ppIVar3 = (pIVar13->Windows).Data;
    if (ppIVar3 != (ImGuiWindow **)0x0) {
      (pIVar13->Windows).Size = 0;
      pIVar14 = GImGui;
      (pIVar13->Windows).Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(ppIVar3);
      (pIVar13->Windows).Data = (ImGuiWindow **)0x0;
    }
    ppIVar3 = (pIVar13->WindowsSortBuffer).Data;
    if (ppIVar3 != (ImGuiWindow **)0x0) {
      (pIVar13->WindowsSortBuffer).Size = 0;
      pIVar14 = GImGui;
      (pIVar13->WindowsSortBuffer).Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(ppIVar3);
      (pIVar13->WindowsSortBuffer).Data = (ImGuiWindow **)0x0;
    }
    pIVar13->CurrentWindow = (ImGuiWindow *)0x0;
    ppIVar3 = (pIVar13->CurrentWindowStack).Data;
    if (ppIVar3 != (ImGuiWindow **)0x0) {
      (pIVar13->CurrentWindowStack).Size = 0;
      pIVar14 = GImGui;
      (pIVar13->CurrentWindowStack).Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(ppIVar3);
      (pIVar13->CurrentWindowStack).Data = (ImGuiWindow **)0x0;
    }
    pIVar13->NavWindow = (ImGuiWindow *)0x0;
    pIVar13->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar13->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar13->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar13->MovedWindow = (ImGuiWindow *)0x0;
    if (0 < (pIVar13->Settings).Size) {
      lVar15 = 0;
      lVar16 = 0;
      do {
        pvVar4 = *(void **)((long)&((pIVar13->Settings).Data)->Name + lVar15);
        if (pvVar4 != (void *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pvVar4);
        lVar16 = lVar16 + 1;
        lVar15 = lVar15 + 0x20;
      } while (lVar16 < (pIVar13->Settings).Size);
    }
    pIVar5 = (pIVar13->Settings).Data;
    if (pIVar5 != (ImGuiIniData *)0x0) {
      (pIVar13->Settings).Size = 0;
      pIVar14 = GImGui;
      (pIVar13->Settings).Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(pIVar5);
      (pIVar13->Settings).Data = (ImGuiIniData *)0x0;
    }
    pIVar6 = (pIVar13->ColorModifiers).Data;
    if (pIVar6 != (ImGuiColMod *)0x0) {
      (pIVar13->ColorModifiers).Size = 0;
      pIVar14 = GImGui;
      (pIVar13->ColorModifiers).Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(pIVar6);
      (pIVar13->ColorModifiers).Data = (ImGuiColMod *)0x0;
    }
    pIVar7 = (pIVar13->StyleModifiers).Data;
    if (pIVar7 != (ImGuiStyleMod *)0x0) {
      (pIVar13->StyleModifiers).Size = 0;
      pIVar14 = GImGui;
      (pIVar13->StyleModifiers).Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(pIVar7);
      (pIVar13->StyleModifiers).Data = (ImGuiStyleMod *)0x0;
    }
    ppIVar8 = (pIVar13->FontStack).Data;
    if (ppIVar8 != (ImFont **)0x0) {
      (pIVar13->FontStack).Size = 0;
      pIVar14 = GImGui;
      (pIVar13->FontStack).Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(ppIVar8);
      (pIVar13->FontStack).Data = (ImFont **)0x0;
    }
    pIVar9 = (pIVar13->OpenPopupStack).Data;
    if (pIVar9 != (ImGuiPopupRef *)0x0) {
      (pIVar13->OpenPopupStack).Size = 0;
      pIVar14 = GImGui;
      (pIVar13->OpenPopupStack).Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(pIVar9);
      (pIVar13->OpenPopupStack).Data = (ImGuiPopupRef *)0x0;
    }
    pIVar9 = (pIVar13->CurrentPopupStack).Data;
    if (pIVar9 != (ImGuiPopupRef *)0x0) {
      (pIVar13->CurrentPopupStack).Size = 0;
      pIVar14 = GImGui;
      (pIVar13->CurrentPopupStack).Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(pIVar9);
      (pIVar13->CurrentPopupStack).Data = (ImGuiPopupRef *)0x0;
    }
    pIVar13->SetNextWindowSizeConstraintCallback = (ImGuiSizeConstraintCallback)0x0;
    pIVar13->SetNextWindowSizeConstraintCallbackUserData = (void *)0x0;
    lVar15 = 0x18c8;
    do {
      pvVar4 = *(void **)((long)(pIVar13->IO).KeyMap + lVar15 + -0x34);
      if (pvVar4 != (void *)0x0) {
        *(undefined8 *)((long)(pIVar13->IO).KeyMap + lVar15 + -0x3c) = 0;
        pIVar14 = GImGui;
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
        (*(pIVar14->IO).MemFreeFn)(pvVar4);
        *(undefined8 *)((long)(pIVar13->IO).KeyMap + lVar15 + -0x34) = 0;
      }
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x18f8);
    ImDrawList::ClearFreeMemory(&pIVar13->OverlayDrawList);
    pcVar10 = (pIVar13->PrivateClipboard).Data;
    if (pcVar10 != (char *)0x0) {
      (pIVar13->PrivateClipboard).Size = 0;
      pIVar14 = GImGui;
      (pIVar13->PrivateClipboard).Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(pcVar10);
      (pIVar13->PrivateClipboard).Data = (char *)0x0;
    }
    puVar11 = (pIVar13->InputTextState).Text.Data;
    if (puVar11 != (unsigned_short *)0x0) {
      (pIVar13->InputTextState).Text.Size = 0;
      pIVar14 = GImGui;
      (pIVar13->InputTextState).Text.Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(puVar11);
      (pIVar13->InputTextState).Text.Data = (unsigned_short *)0x0;
    }
    pcVar10 = (pIVar13->InputTextState).InitialText.Data;
    if (pcVar10 != (char *)0x0) {
      (pIVar13->InputTextState).InitialText.Size = 0;
      pIVar14 = GImGui;
      (pIVar13->InputTextState).InitialText.Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(pcVar10);
      (pIVar13->InputTextState).InitialText.Data = (char *)0x0;
    }
    pcVar10 = (pIVar13->InputTextState).TempTextBuffer.Data;
    if (pcVar10 != (char *)0x0) {
      (pIVar13->InputTextState).TempTextBuffer.Size = 0;
      pIVar14 = GImGui;
      (pIVar13->InputTextState).TempTextBuffer.Capacity = 0;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar14->IO).MemFreeFn)(pcVar10);
      (pIVar13->InputTextState).TempTextBuffer.Data = (char *)0x0;
    }
    __stream = (FILE *)pIVar13->LogFile;
    if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
      fclose(__stream);
      pIVar13->LogFile = (FILE *)0x0;
    }
    if (&pIVar13->LogClipboard->Buf != (ImVector<char> *)0x0) {
      ImVector<char>::~ImVector(&pIVar13->LogClipboard->Buf);
      pIVar12 = pIVar13->LogClipboard;
      if (pIVar12 != (ImGuiTextBuffer *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar12);
    }
    pIVar13->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown()
{
    ImGuiContext& g = *GImGui;

    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    if (g.IO.Fonts) // Testing for NULL to allow user to NULLify in case of running Shutdown() on multiple contexts. Bit hacky.
        g.IO.Fonts->Clear();

    // Cleanup of other data are conditional on actually having initialize ImGui.
    if (!g.Initialized)
        return;

    SaveIniSettingsToDisk(g.IO.IniFilename);

    for (int i = 0; i < g.Windows.Size; i++)
    {
        g.Windows[i]->~ImGuiWindow();
        ImGui::MemFree(g.Windows[i]);
    }
    g.Windows.clear();
    g.WindowsSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.NavWindow = NULL;
    g.HoveredWindow = NULL;
    g.HoveredRootWindow = NULL;
    g.ActiveIdWindow = NULL;
    g.MovedWindow = NULL;
    for (int i = 0; i < g.Settings.Size; i++)
        ImGui::MemFree(g.Settings[i].Name);
    g.Settings.clear();
    g.ColorModifiers.clear();
    g.StyleModifiers.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.CurrentPopupStack.clear();
    g.SetNextWindowSizeConstraintCallback = NULL;
    g.SetNextWindowSizeConstraintCallbackUserData = NULL;
    for (int i = 0; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
        g.RenderDrawLists[i].clear();
    g.OverlayDrawList.ClearFreeMemory();
    g.PrivateClipboard.clear();
    g.InputTextState.Text.clear();
    g.InputTextState.InitialText.clear();
    g.InputTextState.TempTextBuffer.clear();

    if (g.LogFile && g.LogFile != stdout)
    {
        fclose(g.LogFile);
        g.LogFile = NULL;
    }
    if (g.LogClipboard)
    {
        g.LogClipboard->~ImGuiTextBuffer();
        ImGui::MemFree(g.LogClipboard);
    }

    g.Initialized = false;
}